

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  size_t *psVar1;
  pointer pcVar2;
  char *pcVar3;
  Stream *pSVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t __src;
  Token *pTVar7;
  Node *pNVar8;
  ulong uVar9;
  ptrdiff_t _Num;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *Size;
  SMLoc Start;
  _Alloc_hider _Var10;
  Token local_2b0;
  Token local_278;
  Token local_240;
  Token local_208;
  Token local_1d0;
  Token local_198;
  Token local_160;
  _func_int **local_128;
  Child local_120;
  undefined1 auStack_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Child CStack_e8;
  Token TagInfo;
  ulong uStack_a8;
  Token T;
  Child CStack_68;
  Token AnchorInfo;
  
  pTVar7 = Scanner::peekNext((Scanner *)
                             (this->stream->scanner)._M_t.
                             super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                             .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  uStack_a8 = *(ulong *)pTVar7;
  T._0_8_ = (pTVar7->Range).Data;
  psVar1 = &T.Range.Length;
  T.Range.Data = (char *)(pTVar7->Range).Length;
  T.Range.Length = (size_t)&T.Value._M_string_length;
  pcVar2 = (pTVar7->Value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + (pTVar7->Value)._M_string_length);
  CStack_68.twine = (Twine *)0x0;
  AnchorInfo.Kind = TK_Error;
  AnchorInfo._4_4_ = 0;
  AnchorInfo.Range.Data = (char *)0x0;
  AnchorInfo.Range.Length = (size_t)&AnchorInfo.Value._M_string_length;
  AnchorInfo.Value._M_dataplus._M_p = (pointer)0x0;
  AnchorInfo.Value._M_string_length._0_1_ = 0;
  CStack_e8.twine = (Twine *)((ulong)(uint)CStack_e8._4_4_ << 0x20);
  TagInfo.Kind = TK_Error;
  TagInfo._4_4_ = 0;
  TagInfo.Range.Data = (char *)0x0;
  TagInfo.Range.Length = (size_t)&TagInfo.Value._M_string_length;
  TagInfo.Value._M_dataplus._M_p = (pointer)0x0;
  TagInfo.Value._M_string_length._0_1_ = 0;
LAB_00da7f49:
  switch(uStack_a8 & 0xffffffff) {
  case 0:
    goto switchD_00da7f60_caseD_0;
  default:
    pNVar8 = (Node *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 0;
      (pNVar8->Anchor).Data = (char *)0x0;
      (pNVar8->Anchor).Length = 0;
      (pNVar8->Tag).Data = (char *)0x0;
      (pNVar8->Tag).Length = 0;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      goto LAB_00da88b0;
    }
    goto switchD_00da7f60_caseD_0;
  case 7:
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar8 == (Node *)0x0) goto switchD_00da7f60_caseD_0;
    pSVar4 = this->stream;
    pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
    pNVar8->Doc = &pSVar4->CurrentDoc;
    (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar8->SourceRange).End.Ptr = (char *)0x0;
    pNVar8->TypeID = 5;
    (pNVar8->Anchor).Data =
         (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
    (pNVar8->Anchor).Length =
         (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
    (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
    (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                ((pSVar4->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar5 = (pTVar7->Range).Data;
    (pNVar8->SourceRange).Start.Ptr = pcVar5;
    (pNVar8->SourceRange).End.Ptr = pcVar5;
    pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079830;
    *(undefined4 *)&pNVar8[1]._vptr_Node = 2;
    break;
  case 9:
    Scanner::getNext(&local_278,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.Value._M_dataplus._M_p != &local_278.Value.field_2) {
      operator_delete(local_278.Value._M_dataplus._M_p,
                      local_278.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar8 == (Node *)0x0) goto switchD_00da7f60_caseD_0;
    pSVar4 = this->stream;
    pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
    pNVar8->Doc = &pSVar4->CurrentDoc;
    (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar8->SourceRange).End.Ptr = (char *)0x0;
    pNVar8->TypeID = 5;
    (pNVar8->Anchor).Data =
         (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
    (pNVar8->Anchor).Length =
         (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
    (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
    (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                ((pSVar4->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar5 = (pTVar7->Range).Data;
    (pNVar8->SourceRange).Start.Ptr = pcVar5;
    (pNVar8->SourceRange).End.Ptr = pcVar5;
    pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079830;
    *(undefined4 *)&pNVar8[1]._vptr_Node = 0;
    break;
  case 10:
    Scanner::getNext(&local_240,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.Value._M_dataplus._M_p != &local_240.Value.field_2) {
      operator_delete(local_240.Value._M_dataplus._M_p,
                      local_240.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 4;
      (pNVar8->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar8->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      pcVar5 = (pTVar7->Range).Data;
      (pNVar8->SourceRange).Start.Ptr = pcVar5;
      (pNVar8->SourceRange).End.Ptr = pcVar5;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079810;
      *(undefined4 *)&pNVar8[1]._vptr_Node = 0;
      goto LAB_00da8693;
    }
    goto switchD_00da7f60_caseD_0;
  case 0xb:
  case 0xd:
  case 0xf:
    if ((this->Root == (Node *)0x0) || ((this->Root->TypeID & 0xfffffffe) != 4)) {
      Twine::Twine((Twine *)&local_120,"Unexpected token");
      Scanner::setError((Scanner *)
                        (this->stream->scanner)._M_t.
                        super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                        .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_120,
                        (iterator)T._0_8_);
    }
    else {
      pNVar8 = (Node *)Node::operator_new(0x48,&this->NodeAllocator,0x10);
      if (pNVar8 != (Node *)0x0) {
        pSVar4 = this->stream;
        pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
        pNVar8->Doc = &pSVar4->CurrentDoc;
        (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
        (pNVar8->SourceRange).End.Ptr = (char *)0x0;
        pNVar8->TypeID = 0;
        (pNVar8->Anchor).Data = (char *)0x0;
        (pNVar8->Anchor).Length = 0;
        (pNVar8->Tag).Data = (char *)0x0;
        (pNVar8->Tag).Length = 0;
        pTVar7 = Scanner::peekNext(*(Scanner **)
                                    ((pSVar4->CurrentDoc)._M_t.
                                     super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                     .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                    _M_head_impl)->stream);
LAB_00da88b0:
        pcVar5 = (pTVar7->Range).Data;
        (pNVar8->SourceRange).Start.Ptr = pcVar5;
        (pNVar8->SourceRange).End.Ptr = pcVar5;
        pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079790;
        goto LAB_00da8928;
      }
    }
    goto switchD_00da7f60_caseD_0;
  case 0xc:
    Scanner::getNext(&local_208,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.Value._M_dataplus._M_p != &local_208.Value.field_2) {
      operator_delete(local_208.Value._M_dataplus._M_p,
                      local_208.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar8 == (Node *)0x0) goto switchD_00da7f60_caseD_0;
    pSVar4 = this->stream;
    pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
    pNVar8->Doc = &pSVar4->CurrentDoc;
    (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
    (pNVar8->SourceRange).End.Ptr = (char *)0x0;
    pNVar8->TypeID = 5;
    (pNVar8->Anchor).Data =
         (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
    (pNVar8->Anchor).Length =
         (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
    (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
    (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                ((pSVar4->CurrentDoc)._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream);
    pcVar5 = (pTVar7->Range).Data;
    (pNVar8->SourceRange).Start.Ptr = pcVar5;
    (pNVar8->SourceRange).End.Ptr = pcVar5;
    pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079830;
    *(undefined4 *)&pNVar8[1]._vptr_Node = 1;
    break;
  case 0xe:
    Scanner::getNext(&local_1d0,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.Value._M_dataplus._M_p != &local_1d0.Value.field_2) {
      operator_delete(local_1d0.Value._M_dataplus._M_p,
                      local_1d0.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 4;
      (pNVar8->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar8->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      pcVar5 = (pTVar7->Range).Data;
      (pNVar8->SourceRange).Start.Ptr = pcVar5;
      (pNVar8->SourceRange).End.Ptr = pcVar5;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079810;
      *(undefined4 *)&pNVar8[1]._vptr_Node = 1;
      goto LAB_00da8693;
    }
    goto switchD_00da7f60_caseD_0;
  case 0x10:
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 4;
      (pNVar8->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar8->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      pcVar5 = (pTVar7->Range).Data;
      (pNVar8->SourceRange).Start.Ptr = pcVar5;
      (pNVar8->SourceRange).End.Ptr = pcVar5;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079810;
      *(undefined4 *)&pNVar8[1]._vptr_Node = 2;
LAB_00da8693:
      *(undefined2 *)((long)&pNVar8[1]._vptr_Node + 4) = 1;
      goto LAB_00da8775;
    }
    goto switchD_00da7f60_caseD_0;
  case 0x12:
    Scanner::getNext(&local_198,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.Value._M_dataplus._M_p != &local_198.Value.field_2) {
      operator_delete(local_198.Value._M_dataplus._M_p,
                      local_198.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    pcVar5 = T.Range.Data;
    uVar6 = T._0_8_;
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 1;
      (pNVar8->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar8->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
      Scanner::peekNext(*(Scanner **)
                         ((pSVar4->CurrentDoc)._M_t.
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream);
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_010797b0;
      pNVar8[1]._vptr_Node = (_func_int **)uVar6;
      pNVar8[1].Doc =
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)pcVar5;
      (pNVar8->SourceRange).Start.Ptr = (char *)uVar6;
      (pNVar8->SourceRange).End.Ptr = pcVar5 + uVar6;
      goto LAB_00da8928;
    }
    goto switchD_00da7f60_caseD_0;
  case 0x13:
    Scanner::getNext(&local_160,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.Value._M_dataplus._M_p != &local_160.Value.field_2) {
      operator_delete(local_160.Value._M_dataplus._M_p,
                      local_160.Value.field_2._M_allocated_capacity + 1);
    }
    __src = T.Range.Length;
    Size = (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
           (T.Value._M_dataplus._M_p + 1);
    if (Size == (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0)
    {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0x289,"StringRef llvm::StringRef::drop_back(size_t) const");
    }
    local_128 = (_func_int **)
                BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                          (&this->NodeAllocator,(size_t)Size,(Align)0x0);
    memmove(local_128,(void *)__src,(size_t)Size);
    _Var10._M_p = T.Value._M_dataplus._M_p;
    if (Size < T.Value._M_dataplus._M_p) {
      _Var10._M_p = (pointer)Size;
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    pcVar5 = T.Range.Data;
    uVar6 = T._0_8_;
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 2;
      (pNVar8->Anchor).Data =
           (char *)((ulong)(AnchorInfo.Range.Data != (char *)0x0) + AnchorInfo._0_8_);
      (pNVar8->Anchor).Length =
           (long)AnchorInfo.Range.Data - (ulong)(AnchorInfo.Range.Data != (char *)0x0);
      (pNVar8->Tag).Data = (char *)TagInfo._0_8_;
      (pNVar8->Tag).Length = (size_t)TagInfo.Range.Data;
      Scanner::peekNext(*(Scanner **)
                         ((pSVar4->CurrentDoc)._M_t.
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream);
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_010797d0;
      pNVar8[1]._vptr_Node = local_128;
      pNVar8[1].Doc =
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
           _Var10._M_p;
      (pNVar8->SourceRange).Start.Ptr = (char *)uVar6;
      (pNVar8->SourceRange).End.Ptr = pcVar5 + uVar6;
      goto LAB_00da8928;
    }
    goto switchD_00da7f60_caseD_0;
  case 0x14:
    Scanner::getNext(&local_2b0,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.Value._M_dataplus._M_p != &local_2b0.Value.field_2) {
      operator_delete(local_2b0.Value._M_dataplus._M_p,
                      local_2b0.Value.field_2._M_allocated_capacity + 1);
    }
    pNVar8 = (Node *)Node::operator_new(0x58,&this->NodeAllocator,0x10);
    pcVar5 = T.Range.Data;
    uVar6 = T._0_8_;
    if (pNVar8 != (Node *)0x0) {
      pSVar4 = this->stream;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079770;
      pNVar8->Doc = &pSVar4->CurrentDoc;
      (pNVar8->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar8->SourceRange).End.Ptr = (char *)0x0;
      pNVar8->TypeID = 6;
      (pNVar8->Anchor).Data = (char *)0x0;
      (pNVar8->Anchor).Length = 0;
      (pNVar8->Tag).Data = (char *)0x0;
      (pNVar8->Tag).Length = 0;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  ((pSVar4->CurrentDoc)._M_t.
                                   super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                   .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                  _M_head_impl)->stream);
      uVar9 = (ulong)(pcVar5 != (char *)0x0);
      pcVar3 = (pTVar7->Range).Data;
      (pNVar8->SourceRange).Start.Ptr = pcVar3;
      (pNVar8->SourceRange).End.Ptr = pcVar3;
      pNVar8->_vptr_Node = (_func_int **)&PTR_anchor_01079850;
      pNVar8[1]._vptr_Node = (_func_int **)(uVar6 + uVar9);
      pNVar8[1].Doc =
           (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)
           (pcVar5 + -uVar9);
      goto LAB_00da8928;
    }
    goto switchD_00da7f60_caseD_0;
  case 0x15:
    if (CStack_68._0_4_ != 0x15) {
      Scanner::getNext((Token *)&local_120,
                       (Scanner *)
                       (this->stream->scanner)._M_t.
                       super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                       .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
      AnchorInfo.Range.Data = (char *)auStack_118._8_8_;
      CStack_68 = local_120;
      AnchorInfo._0_8_ = auStack_118._0_8_;
      pTVar7 = &AnchorInfo;
      goto LAB_00da7fd4;
    }
    Twine::Twine((Twine *)&local_120,"Already encountered an anchor for this node!");
    Scanner::setError((Scanner *)
                      (this->stream->scanner)._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                      .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_120,
                      (iterator)T._0_8_);
    goto switchD_00da7f60_caseD_0;
  case 0x16:
    if (CStack_e8._0_4_ == 0x16) {
      Twine::Twine((Twine *)&local_120,"Already encountered a tag for this node!");
      Scanner::setError((Scanner *)
                        (this->stream->scanner)._M_t.
                        super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                        .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>,(Twine *)&local_120,
                        (iterator)T._0_8_);
      goto switchD_00da7f60_caseD_0;
    }
    Scanner::getNext((Token *)&local_120,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    TagInfo.Range.Data = (char *)auStack_118._8_8_;
    CStack_e8 = local_120;
    TagInfo._0_8_ = auStack_118._0_8_;
    pTVar7 = &TagInfo;
LAB_00da7fd4:
    std::__cxx11::string::operator=((string *)&(pTVar7->Range).Length,(string *)&local_108);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8._M_allocated_capacity + 1);
    }
    pTVar7 = Scanner::peekNext((Scanner *)
                               (this->stream->scanner)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    T.Range.Data = (char *)(pTVar7->Range).Length;
    uStack_a8 = *(ulong *)pTVar7;
    T._0_8_ = (pTVar7->Range).Data;
    std::__cxx11::string::_M_assign((string *)psVar1);
    goto LAB_00da7f49;
  }
  *(undefined2 *)((long)&pNVar8[1]._vptr_Node + 4) = 1;
  *(undefined1 *)((long)&pNVar8[1]._vptr_Node + 6) = 1;
LAB_00da8775:
  pNVar8[1].Doc =
       (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0;
  goto LAB_00da8928;
switchD_00da7f60_caseD_0:
  pNVar8 = (Node *)0x0;
LAB_00da8928:
  if ((size_type *)TagInfo.Range.Length != &TagInfo.Value._M_string_length) {
    operator_delete((void *)TagInfo.Range.Length,
                    CONCAT71(TagInfo.Value._M_string_length._1_7_,
                             (undefined1)TagInfo.Value._M_string_length) + 1);
  }
  if ((size_type *)AnchorInfo.Range.Length != &AnchorInfo.Value._M_string_length) {
    operator_delete((void *)AnchorInfo.Range.Length,
                    CONCAT71(AnchorInfo.Value._M_string_length._1_7_,
                             (undefined1)AnchorInfo.Value._M_string_length) + 1);
  }
  if ((size_type *)T.Range.Length != &T.Value._M_string_length) {
    operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
  }
  return pNVar8;
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_FlowMappingEnd:
  case Token::TK_FlowSequenceEnd:
  case Token::TK_FlowEntry: {
    if (Root && (isa<MappingNode>(Root) || isa<SequenceNode>(Root)))
      return new (NodeAllocator) NullNode(stream.CurrentDoc);

    setError("Unexpected token", T);
    return nullptr;
  }
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}